

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  appender out_00;
  appender out_01;
  appender out_02;
  appender out_03;
  bool bVar1;
  type tVar2;
  int iVar3;
  int iVar4;
  appender *paVar5;
  float_specs in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RDI;
  undefined8 in_R8;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_40_8_dbbf3351 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  sign_t sign;
  char zero;
  int significand_size;
  significand_type significand;
  byte local_291;
  locale_ref in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  undefined1 *size_00;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  int iVar6;
  undefined4 in_stack_fffffffffffffd8c;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  int local_258;
  char local_251;
  anon_class_40_8_dbbf3351 *in_stack_fffffffffffffdb0;
  undefined1 localized;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffdb8;
  locale_ref in_stack_fffffffffffffdc0;
  int local_20c;
  undefined1 local_1b8 [68];
  int local_174;
  char *local_170;
  undefined8 *local_168;
  int *local_160;
  undefined8 *local_158;
  undefined1 *local_150;
  float_specs *local_148;
  char *local_140;
  int *local_138;
  char *local_130;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_128;
  undefined8 local_110;
  undefined1 local_108 [64];
  int local_c8;
  int local_c4;
  buffer<char> *local_c0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_b8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_b0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_a8;
  char local_a0;
  undefined8 local_98;
  int local_90;
  char local_8c;
  int local_88;
  undefined1 local_84;
  undefined1 local_83;
  int local_80;
  undefined1 local_75;
  undefined4 local_74;
  int local_70;
  int local_6c;
  anon_class_12_2_f0c9b3c6 local_68;
  int local_5c;
  undefined8 local_58;
  char local_49;
  ulong local_48;
  char local_3e [2];
  int local_3c;
  undefined8 local_38;
  int *local_30;
  undefined8 *local_28;
  undefined8 local_20;
  float_specs local_18;
  appender local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_38 = *in_RSI;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)in_RDI.container;
  local_3c = get_significand_size<double>((decimal_fp<double> *)0x1c0e1f);
  local_3e[1] = 0x30;
  local_3e[0] = local_18._5_1_;
  tVar2 = to_unsigned<int>(0);
  local_48 = (ulong)(tVar2 + (local_3e[0] != '\0'));
  if (((uint)local_18._4_4_ >> 0x11 & 1) == 0) {
    local_251 = '.';
  }
  else {
    local_58 = local_20;
    local_251 = decimal_point<char>(in_stack_fffffffffffffd70);
  }
  local_49 = local_251;
  local_68.output_exp = *(int *)(local_28 + 1) + local_3c + -1;
  local_68.fspecs = local_18;
  local_5c = local_68.output_exp;
  bVar1 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<double>,_char,_fmt::v10::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_68);
  if (bVar1) {
    local_6c = 0;
    if (((uint)local_18._4_4_ >> 0x13 & 1) == 0) {
      if (local_3c == 1) {
        local_49 = '\0';
      }
    }
    else {
      local_6c = local_18.precision - local_3c;
      if (local_6c < 0) {
        local_6c = 0;
      }
      tVar2 = to_unsigned<int>(0);
      local_48 = tVar2 + local_48;
    }
    if (local_5c < 0) {
      local_258 = -local_5c;
    }
    else {
      local_258 = local_5c;
    }
    local_70 = local_258;
    local_74 = 2;
    if ((99 < local_258) && (local_74 = 3, 999 < local_258)) {
      local_74 = 4;
    }
    tVar2 = to_unsigned<int>(0);
    local_48 = tVar2 + local_48;
    local_83 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      local_83 = 0x65;
    }
    local_a0 = local_3e[0];
    local_98 = local_38;
    local_90 = local_3c;
    local_8c = local_49;
    local_88 = local_6c;
    local_84 = 0x30;
    local_80 = local_5c;
    local_75 = local_83;
    if (*local_30 < 1) {
      local_b0 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      paVar5 = reserve<fmt::v10::appender>(&local_10,local_48);
      local_c0 = (paVar5->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_b8.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<double>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8.container);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_b0.container,(appender)local_b8.container);
    }
    else {
      local_a8 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffd8c;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffd88;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out_00,(format_specs<char> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      in_stack_fffffffffffffd78,
                      (anon_class_40_8_dbbf3351 *)in_stack_fffffffffffffd70.locale_);
    }
  }
  else {
    local_c4 = *(int *)(local_28 + 1) + local_3c;
    if (*(int *)(local_28 + 1) < 0) {
      if (local_c4 < 1) {
        local_20c = -local_c4;
        if (((local_3c == 0) && (-1 < local_18.precision)) && (local_18.precision < local_20c)) {
          local_20c = local_18.precision;
        }
        local_291 = 1;
        if ((local_20c == 0) && (local_291 = 1, local_3c == 0)) {
          local_291 = (byte)((uint)local_18._4_4_ >> 0x13) & 1;
        }
        tVar2 = to_unsigned<int>(0);
        local_48 = ((local_291 != 0) + 1 + tVar2) + local_48;
        out_03.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
             in_stack_fffffffffffffd8c;
        out_03.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
             in_stack_fffffffffffffd88;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>
                       (out_03,(format_specs<char> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        in_stack_fffffffffffffd78,
                        (anon_class_56_7_162c6e41 *)in_stack_fffffffffffffd70.locale_);
      }
      else {
        if (((uint)local_18._4_4_ >> 0x13 & 1) == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_18.precision - local_3c;
        }
        iVar6 = iVar3;
        if (iVar3 < 1) {
          iVar6 = 0;
        }
        local_174 = iVar3;
        tVar2 = to_unsigned<int>(0);
        local_48 = local_48 + (tVar2 + 1);
        size_00 = local_1b8;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)in_stack_fffffffffffffdb8.container,
                   in_stack_fffffffffffffdc0,SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
        iVar4 = digit_grouping<char>::count_separators
                          ((digit_grouping<char> *)
                           CONCAT17(in_stack_fffffffffffffda7,
                                    CONCAT16(in_stack_fffffffffffffda6,
                                             CONCAT24(in_stack_fffffffffffffda4,
                                                      in_stack_fffffffffffffda0))),iVar4);
        tVar2 = to_unsigned<int>(0);
        local_48 = local_48 + tVar2;
        out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = iVar3;
        out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ = iVar6;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>
                       (out_02,(format_specs<char> *)CONCAT44(iVar4,in_stack_fffffffffffffd80),
                        (size_t)size_00,
                        (anon_class_64_8_e6ffa566 *)in_stack_fffffffffffffd70.locale_);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_8.container);
      }
    }
    else {
      tVar2 = to_unsigned<int>(0);
      localized = (undefined1)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
      local_48 = tVar2 + local_48;
      local_c8 = local_18.precision - local_c4;
      abort_fuzzing_if(false);
      if (((uint)local_18._4_4_ >> 0x13 & 1) != 0) {
        local_48 = local_48 + 1;
        if ((local_c8 < 1) && (local_18._4_1_ != '\x02')) {
          local_c8 = 0;
        }
        if (0 < local_c8) {
          tVar2 = to_unsigned<int>(0);
          local_48 = tVar2 + local_48;
        }
      }
      local_110 = local_20;
      iVar4 = (int)((ulong)local_108 >> 0x20);
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffdb8.container,
                 in_stack_fffffffffffffdc0,(bool)localized);
      digit_grouping<char>::count_separators
                ((digit_grouping<char> *)
                 CONCAT17(in_stack_fffffffffffffda7,
                          CONCAT16(in_stack_fffffffffffffda6,
                                   CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))),
                 iVar4);
      tVar2 = to_unsigned<int>(0);
      local_48 = local_48 + tVar2;
      local_128 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      local_170 = local_3e;
      local_168 = &local_38;
      local_160 = &local_3c;
      local_158 = local_28;
      local_150 = local_108;
      local_148 = &local_18;
      local_140 = &local_49;
      local_138 = &local_c8;
      local_130 = local_3e + 1;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffd8c;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffd88;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>
                     (out_01,(format_specs<char> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      in_stack_fffffffffffffd78,
                      (anon_class_72_9_0c6a3a8a *)in_stack_fffffffffffffd70.locale_);
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffd70.locale_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}